

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb_shorten_path_readable(char *path,int len)

{
  size_t sVar1;
  int iVar2;
  char *local_38;
  char *s;
  int r2;
  int r1;
  int n2;
  int n1;
  int n;
  int len_local;
  char *path_local;
  
  sVar1 = strlen(path);
  iVar2 = (int)sVar1;
  path_local = path;
  if ((len < iVar2) && (len < 0x401)) {
    local_38 = stb_strrchr2(path,'/','\\');
    if (local_38 == (char *)0x0) {
      r1 = 0;
      local_38 = path;
      r2 = iVar2;
    }
    else {
      r1 = ((int)local_38 - (int)path) + 1;
      local_38 = local_38 + 1;
      r2 = iVar2 - r1;
    }
    if (r1 < len >> 1) {
      s._4_4_ = r1;
      s._0_4_ = len - r1;
    }
    else if (r2 < len >> 1) {
      s._0_4_ = r2;
      s._4_4_ = len - r2;
    }
    else {
      s._4_4_ = (r1 * len) / iVar2;
      s._0_4_ = (r2 * len) / iVar2;
      iVar2 = len >> 2;
      if (s._4_4_ < iVar2) {
        s._0_4_ = len - iVar2;
        s._4_4_ = iVar2;
      }
      if ((int)s < iVar2) {
        s._4_4_ = len - iVar2;
        s._0_4_ = iVar2;
      }
    }
    if ((r1 < s._4_4_) || (r2 < (int)s)) {
      __assert_fail("r1 <= n1 && r2 <= n2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x8fc,"char *stb_shorten_path_readable(char *, int)");
    }
    if (r1 != 0) {
      stb__add_section(stb_shorten_path_readable::buffer,path,r1,s._4_4_);
    }
    stb__add_section(stb_shorten_path_readable::buffer + s._4_4_,local_38,r2,(int)s);
    stb_shorten_path_readable::buffer[len] = '\0';
    path_local = stb_shorten_path_readable::buffer;
  }
  return path_local;
}

Assistant:

char * stb_shorten_path_readable(char *path, int len)
{
   static char buffer[1024];
   int n = strlen(path),n1,n2,r1,r2;
   char *s;
   if (n <= len) return path;
   if (len > 1024) return path;
   s = stb_strrchr2(path, '/', '\\');
   if (s) {
      n1 = s - path + 1;
      n2 = n - n1;
      ++s;
   } else {
      n1 = 0;
      n2 = n;
      s = path;
   }
   // now we need to reduce r1 and r2 so that they fit in len
   if (n1 < len>>1) {
      r1 = n1;
      r2 = len - r1;
   } else if (n2 < len >> 1) {
      r2 = n2;
      r1 = len - r2;
   } else {
      r1 = n1 * len / n;
      r2 = n2 * len / n;
      if (r1 < len>>2) r1 = len>>2, r2 = len-r1;
      if (r2 < len>>2) r2 = len>>2, r1 = len-r2;
   }
   assert(r1 <= n1 && r2 <= n2);
   if (n1)
      stb__add_section(buffer, path, n1, r1);
   stb__add_section(buffer+r1, s, n2, r2);
   buffer[len] = 0;
   return buffer;
}